

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromUnsignedParts
          (IEEEFloat *this,integerPart *src,uint srcCount,roundingMode rounding_mode)

{
  uint srcBits;
  uint uVar1;
  uint dstCount_00;
  opStatus oVar2;
  integerPart *dst_00;
  lostFraction local_3c;
  lostFraction lost_fraction;
  integerPart *dst;
  uint dstCount;
  uint precision;
  uint omsb;
  roundingMode rounding_mode_local;
  uint srcCount_local;
  integerPart *src_local;
  IEEEFloat *this_local;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  uVar1 = APInt::tcMSB(src,srcCount);
  uVar1 = uVar1 + 1;
  dst_00 = significandParts(this);
  dstCount_00 = partCount(this);
  srcBits = this->semantics->precision;
  if (uVar1 < srcBits) {
    this->exponent = (short)srcBits + -1;
    local_3c = lfExactlyZero;
    APInt::tcExtract(dst_00,dstCount_00,src,uVar1,0);
  }
  else {
    this->exponent = (short)uVar1 + -1;
    local_3c = lostFractionThroughTruncation(src,srcCount,uVar1 - srcBits);
    APInt::tcExtract(dst_00,dstCount_00,src,srcBits,uVar1 - srcBits);
  }
  oVar2 = normalize(this,rounding_mode,local_3c);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromUnsignedParts(
    const integerPart *src, unsigned int srcCount, roundingMode rounding_mode) {
  unsigned int omsb, precision, dstCount;
  integerPart *dst;
  lostFraction lost_fraction;

  category = fcNormal;
  omsb = APInt::tcMSB(src, srcCount) + 1;
  dst = significandParts();
  dstCount = partCount();
  precision = semantics->precision;

  /* We want the most significant PRECISION bits of SRC.  There may not
     be that many; extract what we can.  */
  if (precision <= omsb) {
    exponent = omsb - 1;
    lost_fraction = lostFractionThroughTruncation(src, srcCount,
                                                  omsb - precision);
    APInt::tcExtract(dst, dstCount, src, precision, omsb - precision);
  } else {
    exponent = precision - 1;
    lost_fraction = lfExactlyZero;
    APInt::tcExtract(dst, dstCount, src, omsb, 0);
  }

  return normalize(rounding_mode, lost_fraction);
}